

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_dialer_get_url(nng_dialer id,nng_url **urlp)

{
  nng_url *pnVar1;
  nni_dialer *local_28;
  nni_dialer *d;
  nng_url **ppnStack_18;
  int rv;
  nng_url **urlp_local;
  nng_dialer id_local;
  
  ppnStack_18 = urlp;
  urlp_local._0_4_ = id.id;
  d._4_4_ = nni_dialer_find(&local_28,id.id);
  urlp_local._4_4_ = d._4_4_;
  if (d._4_4_ == 0) {
    pnVar1 = nni_dialer_url(local_28);
    *ppnStack_18 = pnVar1;
    nni_dialer_rele(local_28);
    urlp_local._4_4_ = 0;
  }
  return urlp_local._4_4_;
}

Assistant:

int
nng_dialer_get_url(nng_dialer id, const nng_url **urlp)
{
	int         rv;
	nni_dialer *d;
	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	*urlp = nni_dialer_url(d);
	nni_dialer_rele(d);
	return (0);
}